

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_array_global.cpp
# Opt level: O2

MirFunction * __thiscall
optimization::func_array_global::GlobalVarManager::get_init_func(GlobalVarManager *this)

{
  MirPackage *pMVar1;
  mapped_type *pmVar2;
  allocator<char> local_31;
  key_type local_30;
  
  pMVar1 = this->mir;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"main",&local_31);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
           ::at(&pMVar1->functions,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return pmVar2;
}

Assistant:

mir::inst::MirFunction& get_init_func() { return mir.functions.at("main"); }